

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EpsRefine.h
# Opt level: O2

istream * covenant::operator>>(istream *in,GeneralizationMethod *gen)

{
  bool bVar1;
  string *this;
  GeneralizationMethod GVar2;
  allocator local_59;
  string token;
  string local_38 [32];
  
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  std::operator>>(in,(string *)&token);
  bVar1 = std::operator==(&token,"greedy");
  GVar2 = GREEDY;
  if (!bVar1) {
    bVar1 = std::operator==(&token,"max-gen");
    if (!bVar1) {
      this = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string(local_38,"Invalid generalization method",&local_59);
      std::__cxx11::string::string(this,local_38);
      __cxa_throw(this,&error::typeinfo,error::~error);
    }
    GVar2 = MAX_GEN;
  }
  *gen = GVar2;
  std::__cxx11::string::~string((string *)&token);
  return in;
}

Assistant:

std::istream& operator>>(std::istream& in, GeneralizationMethod& gen)
{
    std::string token;
    in >> token;
    if (token == "greedy")
        gen = GREEDY;
    else if (token == "max-gen")
        gen = MAX_GEN;
    else 
      throw error("Invalid generalization method");
    return in;
}